

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty_printer.hpp
# Opt level: O2

void __thiscall
trial::protocol::json::example::pretty_printer::indent(pretty_printer *this,int level)

{
  basic_writer<char,_16UL> *this_00;
  char *local_40;
  size_t local_38;
  char local_30 [16];
  view_type local_20;
  
  this_00 = this->writer;
  local_40 = local_30;
  std::__cxx11::string::_M_construct((ulong)&local_40,(char)level * (char)this->indent_width);
  local_20._M_len = local_38;
  local_20._M_str = local_40;
  basic_writer<char,_16UL>::literal(this_00,&local_20);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void indent(int level)
    {
        writer.literal(std::string(indent_width * level, ' '));
    }